

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O0

void __thiscall
blcl::net::connection<MsgType>::add_to_incoming_messages_queue(connection<MsgType> *this)

{
  tsqueue<blcl::net::owned_message<MsgType>_> *ptVar1;
  owned_message<MsgType> local_80;
  owned_message<MsgType> local_40;
  connection<MsgType> *local_10;
  connection<MsgType> *this_local;
  
  local_10 = this;
  if (this->owner_type_ == server) {
    ptVar1 = this->incoming_messages_;
    std::enable_shared_from_this<blcl::net::connection<MsgType>_>::shared_from_this
              ((enable_shared_from_this<blcl::net::connection<MsgType>_> *)&local_40);
    message<MsgType>::message(&local_40.msg,&this->current_incoming_message_);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(ptVar1,&local_40);
    owned_message<MsgType>::~owned_message(&local_40);
  }
  else {
    ptVar1 = this->incoming_messages_;
    std::shared_ptr<blcl::net::connection<MsgType>_>::shared_ptr(&local_80.remote,(nullptr_t)0x0);
    message<MsgType>::message(&local_80.msg,&this->current_incoming_message_);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(ptVar1,&local_80);
    owned_message<MsgType>::~owned_message(&local_80);
  }
  read_header(this);
  return;
}

Assistant:

void add_to_incoming_messages_queue() {
            if (owner_type_ == owner::server)
                incoming_messages_.push_back({ this->shared_from_this(), current_incoming_message_ });
            else
                incoming_messages_.push_back({ nullptr, current_incoming_message_ });

            read_header();
        }